

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O3

token * dmrC_primary_expression(dmr_C *C,token *token,expression **tree)

{
  char **__return_storage_ptr__;
  undefined8 uVar1;
  unsigned_long_long uVar2;
  string *psVar3;
  expression *peVar4;
  expression *peVar5;
  int iVar6;
  int *piVar7;
  __int32_t **pp_Var8;
  expression *peVar9;
  scope *psVar10;
  token *ptVar11;
  char *pcVar12;
  symbol *psVar13;
  uint uVar14;
  long lVar15;
  char **extraout_RDX;
  position pVar16;
  char **ppcVar17;
  int size;
  char **ppcVar18;
  byte bVar19;
  global_symbols_t *pgVar20;
  byte bVar21;
  uint uVar22;
  char *pcVar23;
  target_t *ptVar24;
  int want_unsigned;
  bool bVar25;
  bool bVar26;
  longdouble in_ST0;
  char **local_60;
  allocator *local_58;
  position local_50;
  expression *local_48;
  expression *expr;
  position local_38;
  
  local_48 = (expression *)0x0;
  pVar16 = token->pos;
  switch(pVar16._0_4_ & 0x3f) {
  case 2:
    psVar13 = dmrC_lookup_symbol((token->field_2).ident,NS_SYMBOL|NS_TYPEDEF);
    ptVar11 = token->next;
    if (psVar13 == (symbol *)0x0) {
      peVar9 = (expression *)(token->field_2).ident;
      pgVar20 = C->S;
      if ((((peVar9 == (expression *)pgVar20->__func___ident) ||
           (peVar9 == (expression *)pgVar20->__FUNCTION___ident)) ||
          (peVar9 == (expression *)pgVar20->__PRETTY_FUNCTION___ident)) &&
         ((C->current_fn != (symbol *)0x0 && (C->current_fn->ident != (ident *)0x0)))) {
        expr = peVar9;
        local_38 = (position)dmrC_alloc_symbol(pgVar20,token->pos,6);
        (((symbol *)local_38)->field_14).field_2.ctype.base_type = &C->S->char_ctype;
        (((symbol *)local_38)->field_14).field_2.ctype.alignment = 1;
        ((symbol *)local_38)->endpos = token->pos;
        psVar13 = dmrC_alloc_symbol(C->S,token->pos,3);
        (psVar13->field_14).field_2.ctype.base_type = (symbol *)local_38;
        (psVar13->field_14).field_2.ctype.alignment = 1;
        (psVar13->field_14).field_2.ctype.modifiers = 4;
        psVar13->endpos = token->pos;
        dmrC_bind_symbol(C->S,psVar13,(ident *)expr,NS_LABEL);
        *(uint *)psVar13 = *(uint *)psVar13 & 0xfffe00ff | 0x1000;
        local_58 = (allocator *)(ulong)C->current_fn->ident->len;
        expr = (expression *)((long)local_58 + 1);
        local_50 = (position)dmrC_allocator_allocate(&C->string_allocator,(size_t)expr);
        memcpy((string *)((long)local_50 + 4),&C->current_fn->ident->field_0x12,(size_t)local_58);
        *(undefined1 *)((long)&((string *)((long)local_50 + 4))->field_0x0 + (long)local_58) = 0;
        *(uint *)local_50 = ((uint)*(string *)local_50 & 0x80000000) + (int)expr;
        pVar16 = token->pos;
        local_58 = &C->expression_allocator;
        peVar9 = (expression *)dmrC_allocator_allocate(local_58,0);
        *(undefined1 *)peVar9 = 2;
        peVar9->pos = pVar16;
        (psVar13->field_14).field_2.initializer = peVar9;
        (peVar9->field_5).field_2.string = (string *)local_50;
        ((psVar13->field_14).field_2.initializer)->ctype = psVar13;
        local_50 = token->pos;
        psVar10 = (scope *)dmrC_allocator_allocate(local_58,0);
        *(undefined1 *)&psVar10->token = 1;
        psVar10->symbols = (symbol_list *)local_50;
        psVar10[1].symbols = (symbol_list *)expr;
        psVar10->next = (scope *)&C->S->int_ctype;
        (psVar13->field_14).field_0.used_in = psVar10;
        (((anon_union_136_3_e2189aaa_for_symbol_15 *)((long)local_38 + 0x48))->field_0).used_in =
             psVar10;
        iVar6 = C->target->bits_in_char * (int)expr;
        (((anon_union_136_3_e2189aaa_for_symbol_15 *)((long)local_38 + 0x48))->field_1).normal =
             iVar6;
        (psVar13->field_14).field_1.normal = iVar6;
        peVar9 = (expression *)(token->field_2).number;
        pgVar20 = C->S;
      }
      else {
        psVar13 = (symbol *)0x0;
      }
      if (peVar9 == (expression *)pgVar20->__builtin_types_compatible_p_ident) {
        token = builtin_types_compatible_p_expr(C,token,&local_48);
        break;
      }
      local_38 = (position)psVar13;
      if (peVar9 == (expression *)pgVar20->__builtin_offsetof_ident) {
        token = builtin_offsetof_expr(C,token,&local_48);
        break;
      }
    }
    else {
      local_38 = (position)psVar13;
      if ((psVar13->field_0x2 & 0x10) != 0) {
        local_38 = token->pos;
        local_48 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
        *(undefined1 *)local_48 = 1;
        local_48->pos = local_38;
        peVar9 = (psVar13->field_14).field_2.initializer;
        iVar6 = peVar9->op;
        pVar16 = peVar9->pos;
        psVar13 = peVar9->ctype;
        uVar1 = *(undefined8 *)&peVar9->field_0x18;
        uVar2 = (peVar9->field_5).field_0.value;
        psVar3 = (peVar9->field_5).field_2.string;
        peVar4 = (peVar9->field_5).field_10.cond_false;
        peVar5 = (peVar9->field_5).field_14.ident_expression;
        *(undefined4 *)&local_48->field_0x0 = *(undefined4 *)&peVar9->field_0x0;
        local_48->op = iVar6;
        local_48->pos = pVar16;
        local_48->ctype = psVar13;
        *(undefined8 *)&local_48->field_0x18 = uVar1;
        (local_48->field_5).field_0.value = uVar2;
        (local_48->field_5).field_2.string = psVar3;
        (local_48->field_5).field_10.cond_false = peVar4;
        (local_48->field_5).field_14.ident_expression = peVar5;
        local_48->pos = token->pos;
        local_48->field_0x1 = 1;
        token = ptVar11;
        break;
      }
    }
    expr = *(expression **)&token->pos;
    peVar9 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
    *(undefined1 *)peVar9 = 3;
    peVar9->pos = (position)expr;
    pVar16 = (position)(symbol *)0x0;
    local_48 = peVar9;
    if ((local_38 != (position)0x0) && (pVar16 = local_38, (*(uint *)local_38 & 0x1ff00) == 0x200))
    {
      dmrC_sparse_error(C,token->pos,"typename in expression");
      pVar16 = (position)0x0;
    }
    (peVar9->field_5).field_2.string = (string *)token->field_2;
    (peVar9->field_5).field_0.value = (unsigned_long_long)pVar16;
    token = ptVar11;
    break;
  case 3:
    local_48 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
    local_48->pos = pVar16;
    *(undefined2 *)local_48 = 0x103;
    pgVar20 = C->S;
    local_48->ctype = &pgVar20->int_ctype;
    (local_48->field_5).field_3.unop = (expression *)&pgVar20->zero_int;
    (local_48->field_5).field_2.string = (string *)token->field_2;
    goto LAB_00107df1;
  case 4:
    local_48 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
    *(undefined1 *)local_48 = 1;
    local_48->pos = pVar16;
    __return_storage_ptr__ = (char **)(token->field_2).number;
    local_38 = (position)local_48;
    piVar7 = __errno_location();
    *piVar7 = 0;
    if ((*(char *)__return_storage_ptr__ == '0') &&
       (pp_Var8 = __ctype_tolower_loc(),
       (*pp_Var8)[*(byte *)((long)__return_storage_ptr__ + 1)] == 0x62)) {
      iVar6 = 2;
      ppcVar17 = (char **)((long)__return_storage_ptr__ + 2);
    }
    else {
      iVar6 = 0;
      ppcVar17 = __return_storage_ptr__;
    }
    peVar9 = (expression *)strtoull((char *)ppcVar17,(char **)&local_60,iVar6);
    pVar16 = local_38;
    ppcVar17 = extraout_RDX;
    if (local_60 == __return_storage_ptr__) {
LAB_00108383:
      dmrC_string_to_ld((longdouble *)__return_storage_ptr__,(char *)&local_60,ppcVar17);
      ((anon_union_32_18_55d8ca1e_for_expression_5 *)((long)local_38 + 0x20))->fvalue = in_ST0;
      if (__return_storage_ptr__ == local_60) {
LAB_001083c4:
        pVar16 = local_38;
        pcVar12 = dmrC_show_token(C,token);
        pVar16 = *(position *)((long)pVar16 + 8);
        pcVar23 = "constant %s is not a valid number";
        goto LAB_001083dd;
      }
      bVar21 = *(byte *)local_60;
      if (bVar21 == 0) {
        lVar15 = 0x15c8;
      }
      else {
        if (*(byte *)((long)local_60 + 1) != 0) goto LAB_001083c4;
        lVar15 = 0x14e0;
        if (bVar21 < 0x66) {
          if (bVar21 != 0x46) {
            if (bVar21 != 0x4c) goto LAB_001083c4;
LAB_001083fb:
            lVar15 = 0x16b0;
          }
        }
        else if (bVar21 != 0x66) {
          if (bVar21 == 0x6c) goto LAB_001083fb;
          goto LAB_001083c4;
        }
      }
      *(symbol **)((long)local_38 + 0x10) = (symbol *)((long)&C->S->C + lVar15);
      *(undefined2 *)local_38 = 0x21c;
    }
    else {
      if (peVar9 == (expression *)0xffffffffffffffff) {
        bVar26 = *piVar7 != 0x22;
        bVar21 = *(byte *)local_60;
        if (bVar21 != 0) goto LAB_001082f3;
        ppcVar17 = (char **)((long)local_60 + 1);
        if (*piVar7 != 0x22) goto LAB_00108430;
LAB_00108624:
        local_60 = ppcVar17;
        pcVar12 = dmrC_show_token(C,token);
        pVar16 = *(position *)((long)pVar16 + 8);
        pcVar23 = "constant %s is too big even for unsigned long long";
LAB_001083dd:
        dmrC_error_die(C,pVar16,pcVar23,pcVar12);
      }
      bVar21 = *(byte *)local_60;
      bVar26 = true;
      if (bVar21 == 0) {
LAB_00108430:
        local_60 = (char **)((long)local_60 + 1);
        bVar26 = *(char *)__return_storage_ptr__ == '0';
        iVar6 = 0;
LAB_0010843b:
        ptVar24 = C->target;
        uVar14 = ptVar24->bits_in_int - 1;
        uVar22 = 1;
        if (((ulong)peVar9 >> ((byte)uVar14 & 0x3f) & 0xfffffffffffffffe) != 0) {
LAB_0010847c:
          uVar14 = ptVar24->bits_in_long - 1;
          if (((ulong)peVar9 >> ((byte)uVar14 & 0x3f) & 0xfffffffffffffffe) != 0) {
            uVar22 = 1;
            goto LAB_0010849b;
          }
          local_58 = (allocator *)0x13a927;
          if (((ulong)peVar9 >> ((ulong)uVar14 & 0x3f) & 1) == 0) {
            size = 1;
            want_unsigned = iVar6;
          }
          else {
            size = 1;
            want_unsigned = 1;
            if (!bVar26) {
              uVar22 = 3;
              bVar26 = false;
              goto LAB_0010849b;
            }
          }
          goto LAB_00108565;
        }
        bVar25 = ((ulong)peVar9 >> ((ulong)uVar14 & 0x3f) & 1) == 0;
        want_unsigned = 1;
        if (bVar25) {
          want_unsigned = iVar6;
        }
        bVar25 = (bool)(bVar25 | bVar26);
        bVar26 = false;
        size = 0;
        if (!bVar25) goto LAB_0010847c;
      }
      else {
LAB_001082f3:
        bVar19 = 0;
        iVar6 = 0;
        ppcVar18 = local_60;
        local_60 = (char **)((long)local_60 + 1);
        do {
          if ((bVar21 & 0xdf) == 0x4c) {
            if (bVar19 != 0) goto LAB_001083c4;
            bVar19 = *(byte *)local_60;
            if (bVar19 == bVar21) {
              local_60 = (char **)((long)ppcVar18 + 2);
            }
            bVar19 = (bVar19 == bVar21) + 1;
          }
          else {
            ppcVar17 = local_60;
            if ((bVar21 & 0xdf) != 0x55) goto LAB_00108383;
            bVar25 = iVar6 != 0;
            iVar6 = 1;
            if (bVar25) goto LAB_001083c4;
          }
          ppcVar17 = (char **)((long)local_60 + 1);
          bVar21 = *(byte *)local_60;
          ppcVar18 = local_60;
          local_60 = ppcVar17;
        } while (bVar21 != 0);
        if (!bVar26) goto LAB_00108624;
        bVar26 = iVar6 != 0 || *(char *)__return_storage_ptr__ == '0';
        if (bVar19 == 0) goto LAB_0010843b;
        uVar22 = 0;
        ptVar24 = C->target;
        if (bVar19 < 2) goto LAB_0010847c;
LAB_0010849b:
        uVar14 = ptVar24->bits_in_longlong - 1;
        ppcVar17 = local_60;
        if (((ulong)peVar9 >> ((byte)uVar14 & 0x3f) & 0xfffffffffffffffe) != 0) goto LAB_00108624;
        size = 2;
        local_58 = (allocator *)0x13ef3b;
        want_unsigned = iVar6;
        if ((((ulong)peVar9 >> ((ulong)uVar14 & 0x3f) & 1) != 0) && (want_unsigned = 1, !bVar26)) {
          expr = peVar9;
          pcVar12 = dmrC_show_token(C,token);
          dmrC_warning(C,*(position *)((long)local_38 + 8),
                       "decimal constant %s is too big for long long",pcVar12);
          size = 2;
          peVar9 = expr;
        }
LAB_00108565:
        pVar16 = local_38;
        if (uVar22 != 0) {
          local_50._0_4_ = size;
          expr = peVar9;
          pcVar12 = dmrC_show_token(C,token);
          local_38._0_4_ = want_unsigned;
          pcVar23 = " unsigned";
          if (want_unsigned == 0) {
            pcVar23 = "";
          }
          dmrC_warning(C,*(position *)((long)pVar16 + 8),"constant %s is so big it is%s%s%s",pcVar12
                       ,pcVar23," long",local_58);
          if ((uVar22 & 2) != 0) {
            pcVar12 = dmrC_show_token(C,token);
            dmrC_warning(C,*(position *)((long)pVar16 + 8),
                         "decimal constant %s is between LONG_MAX and ULONG_MAX. For C99 that means long long, C90 compilers are very likely to produce unsigned long (and a warning) here"
                         ,pcVar12);
          }
          peVar9 = expr;
          size = local_50._0_4_;
          want_unsigned = local_38._0_4_;
        }
      }
      *(undefined2 *)pVar16 = 0x101;
      psVar13 = dmrC_ctype_integer(C,size,want_unsigned);
      ((expression *)pVar16)->ctype = psVar13;
      (((expression *)pVar16)->field_5).field_3.unop = peVar9;
    }
    goto LAB_00107df1;
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    local_48 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
    local_48->pos = pVar16;
    *(undefined2 *)local_48 = 0x101;
    lVar15 = 0xcb8;
    if ((*(uint *)&token->pos & 0x3e) < 10) {
      lVar15 = 0xa00;
    }
    local_48->ctype = (symbol *)((long)&C->S->C + lVar15);
    dmrC_get_char_constant(C,token,(unsigned_long_long *)&(local_48->field_5).statement);
LAB_00107df1:
    token = token->next;
    break;
  case 0xf:
  case 0x10:
    local_48 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
    *(undefined1 *)local_48 = 2;
    local_48->pos = pVar16;
    token = dmrC_get_string_constant(C,token,local_48);
    break;
  case 0x11:
    if ((token->field_2).special == 0x5b) {
      iVar6 = dmrC_lookup_type(token->next);
      if (iVar6 != 0) {
        pVar16 = token->pos;
        local_48 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
        local_48->pos = pVar16;
        *(undefined2 *)local_48 = 0x104;
        ptVar11 = dmrC_typename(C,token->next,(symbol **)&(local_48->field_5).statement,(int *)0x0);
        token = dmrC_expect_token(C,ptVar11,0x5d,"in type expression");
      }
    }
    else if ((token->field_2).special == 0x28) {
      peVar9 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
      *(undefined1 *)peVar9 = 9;
      peVar9->pos = pVar16;
      peVar9->op = 0x28;
      local_48 = peVar9;
      token = dmrC_parens_expression
                        (C,token,(expression **)&(peVar9->field_5).statement,"in expression");
      if ((peVar9->field_5).statement != (statement *)0x0) {
        peVar9->field_0x1 = *(byte *)((long)&((peVar9->field_5).statement)->type + 1);
      }
    }
  }
  *tree = local_48;
  return token;
}

Assistant:

struct token *dmrC_primary_expression(struct dmr_C *C, struct token *token, struct expression **tree)
{
	struct expression *expr = NULL;

	switch (dmrC_token_type(token)) {
	case TOKEN_CHAR:
	case TOKEN_CHAR_EMBEDDED_0:
	case TOKEN_CHAR_EMBEDDED_1:
	case TOKEN_CHAR_EMBEDDED_2:
	case TOKEN_CHAR_EMBEDDED_3:
	case TOKEN_WIDE_CHAR:
	case TOKEN_WIDE_CHAR_EMBEDDED_0:
	case TOKEN_WIDE_CHAR_EMBEDDED_1:
	case TOKEN_WIDE_CHAR_EMBEDDED_2:
	case TOKEN_WIDE_CHAR_EMBEDDED_3:
		expr = dmrC_alloc_expression(C, token->pos, EXPR_VALUE);   
		expr->flags = Int_const_expr;
		expr->ctype = dmrC_token_type(token) < TOKEN_WIDE_CHAR ? &C->S->int_ctype : &C->S->long_ctype;
		dmrC_get_char_constant(C, token, &expr->value);
		token = token->next;
		break;

	case TOKEN_NUMBER:
		expr = dmrC_alloc_expression(C, token->pos, EXPR_VALUE);
		get_number_value(C, expr, token); /* will see if it's an integer */
		token = token->next;
		break;

	case TOKEN_ZERO_IDENT: {
		expr = dmrC_alloc_expression(C, token->pos, EXPR_SYMBOL);
		expr->flags = Int_const_expr;
		expr->ctype = &C->S->int_ctype;
		expr->symbol = &C->S->zero_int;
		expr->symbol_name = token->ident;
		token = token->next;
		break;
	}

	case TOKEN_IDENT: {
		struct symbol *sym = dmrC_lookup_symbol(token->ident, NS_SYMBOL | NS_TYPEDEF);
		struct token *next = token->next;

		if (!sym) {
			sym = handle_func(C, token);
			if (token->ident == C->S->__builtin_types_compatible_p_ident) {
				token = builtin_types_compatible_p_expr(C, token, &expr);
				break;
			}
			if (token->ident == C->S->__builtin_offsetof_ident) {
				token = builtin_offsetof_expr(C, token, &expr);
				break;
			}
		} else if (sym->enum_member) {
			expr = dmrC_alloc_expression(C, token->pos, EXPR_VALUE);
			*expr = *sym->initializer;
			/* we want the right position reported, thus the copy */
			expr->pos = token->pos;
			expr->flags = Int_const_expr;
			token = next;
			break;
		}

		expr = dmrC_alloc_expression(C, token->pos, EXPR_SYMBOL);

		/*
		 * We support types as real first-class citizens, with type
		 * comparisons etc:
		 *
		 *	if (typeof(a) == int) ..
		 */
		if (sym && sym->ns == NS_TYPEDEF) {
			dmrC_sparse_error(C, token->pos, "typename in expression");
			sym = NULL;
		}
		expr->symbol_name = token->ident;
		expr->symbol = sym;
		token = next;
		break;
	}

	case TOKEN_STRING:
	case TOKEN_WIDE_STRING:
		expr = dmrC_alloc_expression(C, token->pos, EXPR_STRING);
		token = dmrC_get_string_constant(C, token, expr);
		break;

	case TOKEN_SPECIAL:
		if (token->special == '(') {
			expr = dmrC_alloc_expression(C, token->pos, EXPR_PREOP);
			expr->op = '(';
			token = dmrC_parens_expression(C, token, &expr->unop, "in expression");
			if (expr->unop)
				expr->flags = expr->unop->flags;
			break;
		}
		if (token->special == '[' && dmrC_lookup_type(token->next)) {
			expr = dmrC_alloc_expression(C, token->pos, EXPR_TYPE);
			expr->flags = Int_const_expr; /* sic */
			token = dmrC_typename(C, token->next, &expr->symbol, NULL);
			token = dmrC_expect_token(C, token, ']', "in type expression");
			break;
		}
			
	default:
		;
	}
	*tree = expr;
	return token;
}